

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetVendorID(SystemInformationImplementation *this)

{
  SystemInformationImplementation *this_local;
  
  switch(this->ChipManufacturer) {
  case AMD:
    this_local = (SystemInformationImplementation *)0x17e09a;
    break;
  case Intel:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52e56;
    break;
  case NSC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52e78;
    break;
  case UMC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52ebc;
    break;
  case Cyrix:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52e83;
    break;
  case NexGen:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52e9a;
    break;
  case IDT:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52eb1;
    break;
  case Rise:
    this_local = (SystemInformationImplementation *)0x17e199;
    break;
  case Transmeta:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52ede;
    break;
  case Sun:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52ee9;
    break;
  case IBM:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52f00;
    break;
  case Motorola:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52f17;
    break;
  case HP:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52f2e;
    break;
  case UnknownManufacturer:
  default:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_52f45;
  }
  return (char *)this_local;
}

Assistant:

const char * SystemInformationImplementation::GetVendorID()
{
  // Return the vendor ID.
  switch (this->ChipManufacturer)
    {
    case Intel:
      return "Intel Corporation";
    case AMD:
      return "Advanced Micro Devices";
    case NSC:
      return "National Semiconductor";
    case Cyrix:
      return "Cyrix Corp., VIA Inc.";
    case NexGen:
      return "NexGen Inc., Advanced Micro Devices";
    case IDT:
      return "IDT\\Centaur, Via Inc.";
    case UMC:
      return "United Microelectronics Corp.";
    case Rise:
      return "Rise";
    case Transmeta:
      return "Transmeta";
    case Sun:
      return "Sun Microelectronics";
    case IBM:
      return "IBM";
    case Motorola:
      return "Motorola";
    case HP:
      return "Hewlett-Packard";
    case UnknownManufacturer:
    default:
      return "Unknown Manufacturer";
    }
}